

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAXException.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::SAXNotRecognizedException::SAXNotRecognizedException
          (SAXNotRecognizedException *this,XMLCh *msg,MemoryManager *manager)

{
  short *psVar1;
  int iVar2;
  undefined4 extraout_var;
  size_t __n;
  XMLCh *__dest;
  
  (this->super_SAXException)._vptr_SAXException = (_func_int **)&PTR__SAXException_0040b520;
  if (msg == (XMLCh *)0x0) {
    __dest = (XMLCh *)0x0;
  }
  else {
    __n = 0;
    do {
      psVar1 = (short *)((long)msg + __n);
      __n = __n + 2;
    } while (*psVar1 != 0);
    iVar2 = (*manager->_vptr_MemoryManager[3])(manager,__n);
    __dest = (XMLCh *)CONCAT44(extraout_var,iVar2);
    memcpy(__dest,msg,__n);
  }
  (this->super_SAXException).fMsg = __dest;
  (this->super_SAXException).fMemoryManager = manager;
  (this->super_SAXException)._vptr_SAXException = (_func_int **)&PTR__SAXException_0040bc80;
  return;
}

Assistant:

SAXNotRecognizedException::SAXNotRecognizedException(const XMLCh* const msg,
                                                     MemoryManager* const manager)
	: SAXException(msg, manager)
{
}